

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

int __thiscall
QDateTimeEditPrivate::nextPrevSection(QDateTimeEditPrivate *this,int current,bool forward)

{
  bool bVar1;
  qsizetype qVar2;
  byte in_DL;
  int in_ESI;
  QDateTimeEditPrivate *in_RDI;
  QDateTimeEdit *q;
  int local_30;
  byte local_15;
  int local_4;
  
  local_15 = in_DL & 1;
  q_func(in_RDI);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x55d0b7);
  if (bVar1) {
    local_15 = (local_15 ^ 0xff) & 1;
  }
  if (in_ESI == -3) {
    if (local_15 == 0) {
      qVar2 = QList<QDateTimeParser::SectionNode>::size
                        ((QList<QDateTimeParser::SectionNode> *)&in_RDI->field_0x408);
      local_30 = (int)qVar2 + -1;
    }
    else {
      local_30 = -3;
    }
    local_4 = local_30;
  }
  else if (in_ESI == -2) {
    local_4 = -2;
    if (local_15 != 0) {
      local_4 = 0;
    }
  }
  else if (in_ESI == -1) {
    local_4 = -2;
  }
  else {
    local_4 = -1;
    if (local_15 != 0) {
      local_4 = 1;
    }
    local_4 = local_4 + in_ESI;
    qVar2 = QList<QDateTimeParser::SectionNode>::size
                      ((QList<QDateTimeParser::SectionNode> *)&in_RDI->field_0x408);
    if (local_4 < qVar2) {
      if (local_4 < 0) {
        local_4 = -2;
      }
    }
    else {
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int QDateTimeEditPrivate::nextPrevSection(int current, bool forward) const
{
    Q_Q(const QDateTimeEdit);
    if (q->isRightToLeft())
        forward = !forward;

    switch (current) {
    case FirstSectionIndex: return forward ? 0 : FirstSectionIndex;
    case LastSectionIndex: return (forward ? LastSectionIndex : int(sectionNodes.size() - 1));
    case NoSectionIndex: return FirstSectionIndex;
    default: break;
    }
    Q_ASSERT(current >= 0 && current < sectionNodes.size());

    current += (forward ? 1 : -1);
    if (current >= sectionNodes.size()) {
        return LastSectionIndex;
    } else if (current < 0) {
        return FirstSectionIndex;
    }

    return current;
}